

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::set_pattern(string *pattern,pattern_time_type time_type)

{
  undefined4 in_ESI;
  string *in_RDI;
  pointer in_stack_ffffffffffffff18;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *this;
  undefined4 in_stack_ffffffffffffff40;
  custom_flags *custom_user_flags;
  string *eol;
  pattern_time_type time_type_00;
  string *pattern_00;
  pattern_formatter *in_stack_ffffffffffffff90;
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_18;
  undefined4 local_c;
  
  local_c = in_ESI;
  operator_new(0xe0);
  std::__cxx11::string::string(local_38,in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"\n",&local_59);
  eol = (string *)0x0;
  time_type_00 = local;
  custom_user_flags = (custom_flags *)0x0;
  pattern_00 = (string *)0x0;
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                   *)0x2ab453);
  pattern_formatter::pattern_formatter
            (in_stack_ffffffffffffff90,pattern_00,time_type_00,eol,custom_user_flags);
  this = &local_18;
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<std::default_delete<spdlog::formatter>,void>(this,in_stack_ffffffffffffff18);
  set_formatter((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                CONCAT44(local_c,in_stack_ffffffffffffff40));
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr(this);
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                    *)0x2ab4b7);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

SPDLOG_INLINE void set_pattern(std::string pattern, pattern_time_type time_type)
{
    set_formatter(std::unique_ptr<spdlog::formatter>(new pattern_formatter(std::move(pattern), time_type)));
}